

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::internal::JsonUnitTestResultPrinter::EscapeJson
                   (string *__return_storage_ptr__,string *str)

{
  long lVar1;
  ulong uVar2;
  byte *pbVar3;
  Message *pMVar4;
  uchar value;
  long in_FS_OFFSET;
  ulong local_58;
  size_t i;
  string *str_local;
  char local_3a;
  byte local_39;
  char ch;
  Message m;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Message::Message((Message *)&stack0xffffffffffffffc8);
  for (local_58 = 0; uVar2 = std::__cxx11::string::size(), local_58 < uVar2; local_58 = local_58 + 1
      ) {
    pbVar3 = (byte *)std::__cxx11::string::operator[]((ulong)str);
    local_39 = *pbVar3;
    if (local_39 == 8) {
      Message::operator<<((Message *)&stack0xffffffffffffffc8,(char (*) [3])"\\b");
    }
    else if (local_39 == 9) {
      Message::operator<<((Message *)&stack0xffffffffffffffc8,(char (*) [3])"\\t");
    }
    else if (local_39 == 10) {
      Message::operator<<((Message *)&stack0xffffffffffffffc8,(char (*) [3])"\\n");
    }
    else if (local_39 == 0xc) {
      Message::operator<<((Message *)&stack0xffffffffffffffc8,(char (*) [3])"\\f");
    }
    else if (local_39 == 0xd) {
      Message::operator<<((Message *)&stack0xffffffffffffffc8,(char (*) [3])"\\r");
    }
    else if (((local_39 == 0x22) || (local_39 == 0x2f)) || (local_39 == 0x5c)) {
      local_3a = '\\';
      pMVar4 = Message::operator<<((Message *)&stack0xffffffffffffffc8,&local_3a);
      Message::operator<<(pMVar4,(char *)&local_39);
    }
    else if ((char)local_39 < ' ') {
      pMVar4 = Message::operator<<((Message *)&stack0xffffffffffffffc8,(char (*) [5])"\\u00");
      String::FormatByte_abi_cxx11_((string *)&m,(String *)(ulong)local_39,value);
      Message::operator<<(pMVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&m);
      std::__cxx11::string::~string((string *)&m);
    }
    else {
      Message::operator<<((Message *)&stack0xffffffffffffffc8,(char *)&local_39);
    }
  }
  Message::GetString_abi_cxx11_(__return_storage_ptr__,(Message *)&stack0xffffffffffffffc8);
  Message::~Message((Message *)&stack0xffffffffffffffc8);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string JsonUnitTestResultPrinter::EscapeJson(const std::string& str) {
  Message m;

  for (size_t i = 0; i < str.size(); ++i) {
    const char ch = str[i];
    switch (ch) {
      case '\\':
      case '"':
      case '/':
        m << '\\' << ch;
        break;
      case '\b':
        m << "\\b";
        break;
      case '\t':
        m << "\\t";
        break;
      case '\n':
        m << "\\n";
        break;
      case '\f':
        m << "\\f";
        break;
      case '\r':
        m << "\\r";
        break;
      default:
        if (ch < ' ') {
          m << "\\u00" << String::FormatByte(static_cast<unsigned char>(ch));
        } else {
          m << ch;
        }
        break;
    }
  }

  return m.GetString();
}